

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O3

PUThreadKey * p_uthread_local_new(PDestroyFunc free_func)

{
  PUThreadKey *pPVar1;
  
  pPVar1 = (PUThreadKey *)p_malloc0(0x10);
  if (pPVar1 == (PUThreadKey *)0x0) {
    printf("** Error: %s **\n","PUThread::p_uthread_local_new: failed to allocate memory");
  }
  else {
    pPVar1->free_func = free_func;
  }
  return pPVar1;
}

Assistant:

P_LIB_API PUThreadKey *
p_uthread_local_new (PDestroyFunc free_func)
{
	PUThreadKey *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PUThreadKey))) == NULL)) {
		P_ERROR ("PUThread::p_uthread_local_new: failed to allocate memory");
		return NULL;
	}

	ret->free_func = free_func;

	return ret;
}